

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banman.cpp
# Opt level: O3

void __thiscall BanMan::SweepBanned(BanMan *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  int64_t iVar5;
  _Base_ptr p_Var6;
  Logger *this_00;
  iterator __position;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  string local_90;
  direct_or_indirect local_70;
  uint local_60;
  _Base_ptr local_58;
  undefined8 local_50;
  _Base_ptr p_Stack_48;
  undefined1 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = GetTime();
  __position._M_node = (this->m_banned)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_banned)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    bVar4 = false;
    do {
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_70.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)(__position._M_node + 1));
      local_58 = __position._M_node[1]._M_right;
      local_40 = *(undefined1 *)&__position._M_node[2]._M_left;
      local_50 = *(undefined8 *)(__position._M_node + 2);
      p_Stack_48 = __position._M_node[2]._M_parent;
      p_Var2 = __position._M_node[3]._M_parent;
      bVar3 = CSubNet::IsValid((CSubNet *)&local_70.indirect_contents);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      if (!bVar3 || (long)p_Var2 < iVar5) {
        std::
        _Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
        ::erase_abi_cxx11_((_Rb_tree<CSubNet,std::pair<CSubNet_const,CBanEntry>,std::_Select1st<std::pair<CSubNet_const,CBanEntry>>,std::less<CSubNet>,std::allocator<std::pair<CSubNet_const,CBanEntry>>>
                            *)&this->m_banned,__position);
        this->m_is_dirty = true;
        this_00 = LogInstance();
        bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
        if (bVar4) {
          CSubNet::ToString_abi_cxx11_(&local_90,(CSubNet *)&local_70.indirect_contents);
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/banman.cpp"
          ;
          source_file._M_len = 0x5a;
          logging_function._M_str = "SweepBanned";
          logging_function._M_len = 0xb;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function,source_file,0xc4,NET,Debug,(ConstevalFormatString<1U>)0xf6d859
                     ,&local_90);
          bVar4 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          bVar4 = true;
        }
      }
      if (0x10 < local_60) {
        free(local_70.indirect_contents.indirect);
      }
      __position._M_node = p_Var6;
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
    if ((bVar4) && (this->m_client_interface != (CClientUIInterface *)0x0)) {
      CClientUIInterface::BannedListChanged(this->m_client_interface);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BanMan::SweepBanned()
{
    AssertLockHeld(m_banned_mutex);

    int64_t now = GetTime();
    bool notify_ui = false;
    banmap_t::iterator it = m_banned.begin();
    while (it != m_banned.end()) {
        CSubNet sub_net = (*it).first;
        CBanEntry ban_entry = (*it).second;
        if (!sub_net.IsValid() || now > ban_entry.nBanUntil) {
            m_banned.erase(it++);
            m_is_dirty = true;
            notify_ui = true;
            LogDebug(BCLog::NET, "Removed banned node address/subnet: %s\n", sub_net.ToString());
        } else {
            ++it;
        }
    }

    // update UI
    if (notify_ui && m_client_interface) {
        m_client_interface->BannedListChanged();
    }
}